

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * fmt::v5::internal::
          parse_align<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
                    *handler)

{
  char cVar1;
  bool bVar2;
  error_handler *peVar3;
  assertion_failure *this;
  ulong uVar4;
  alignment aVar5;
  bool bVar6;
  
  if (begin == end) {
    this = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this,"");
LAB_0012af1f:
    __cxa_throw(this,&assertion_failure::typeinfo,std::logic_error::~logic_error);
  }
  peVar3 = (error_handler *)(begin + 1);
  uVar4 = (ulong)(peVar3 != (error_handler *)end);
  do {
    cVar1 = (char)begin[uVar4];
    bVar2 = false;
    bVar6 = true;
    if (cVar1 < '>') {
      if (cVar1 == '<') {
        aVar5 = ALIGN_LEFT;
        goto LAB_0012ae82;
      }
      aVar5 = ALIGN_DEFAULT;
      if (cVar1 == '=') {
        aVar5 = ALIGN_NUMERIC;
        bVar2 = true;
        bVar6 = false;
      }
    }
    else {
      if (cVar1 == '>') {
        aVar5 = ALIGN_RIGHT;
      }
      else {
        aVar5 = ALIGN_DEFAULT;
        if (cVar1 != '^') goto LAB_0012ae88;
        aVar5 = ALIGN_CENTER;
      }
LAB_0012ae82:
      bVar6 = false;
      bVar2 = false;
    }
LAB_0012ae88:
    if (!bVar6) {
      if (0 < (long)uVar4) {
        if (*begin == L'{') {
          error_handler::on_error((error_handler *)begin,"invalid fill character \'{\'");
        }
        peVar3 = (error_handler *)(begin + 2);
        (((handler->
          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          ).super_specs_setter<wchar_t>.specs_)->super_align_spec).fill_ = *begin;
        begin = (wchar_t *)peVar3;
      }
      if (bVar2) {
        if (handler->arg_type_ == named_arg_type) {
          this = (assertion_failure *)__cxa_allocate_exception(0x10);
          assertion_failure::assertion_failure(this,"invalid argument type");
          goto LAB_0012af1f;
        }
        if (8 < handler->arg_type_ - named_arg_type) {
          error_handler::on_error
                    ((error_handler *)begin,"format specifier requires numeric argument");
        }
      }
      (((handler->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        ).super_specs_setter<wchar_t>.specs_)->super_align_spec).align_ = aVar5;
      return (wchar_t *)peVar3;
    }
    bVar2 = (long)uVar4 < 1;
    uVar4 = uVar4 - 1;
    if (bVar2) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char *parse_align(
    const Char *begin, const Char *end, Handler &&handler) {
  FMT_ASSERT(begin != end, "");
  alignment align = ALIGN_DEFAULT;
  int i = 0;
  if (begin + 1 != end) ++i;
  do {
    switch (static_cast<char>(begin[i])) {
    case '<':
      align = ALIGN_LEFT;
      break;
    case '>':
      align = ALIGN_RIGHT;
      break;
    case '=':
      align = ALIGN_NUMERIC;
      break;
    case '^':
      align = ALIGN_CENTER;
      break;
    }
    if (align != ALIGN_DEFAULT) {
      if (i > 0) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        begin += 2;
        handler.on_fill(c);
      } else ++begin;
      handler.on_align(align);
      break;
    }
  } while (i-- > 0);
  return begin;
}